

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O1

bool __thiscall
HPack::HuffmanDecoder::decodeStream
          (HuffmanDecoder *this,BitIStream *inputStream,QByteArray *outputBuffer)

{
  char cVar1;
  pointer pPVar2;
  quint64 qVar3;
  ulong uVar4;
  ulong uVar5;
  byte unaff_BL;
  quint32 qVar6;
  quint64 from;
  uint uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  PrefixTable table;
  PrefixTable table_00;
  PrefixTableEntry PVar9;
  quint32 chunk;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    local_3c = 0;
    from = inputStream->offset;
    qVar3 = BitIStream::peekBits<unsigned_int>(inputStream,from,0x20,&local_3c);
    uVar7 = (uint)qVar3;
    if (uVar7 == 0) {
      bVar8 = BitIStream::hasMoreBits(inputStream);
      unaff_BL = !bVar8;
LAB_001e4d9c:
      bVar8 = false;
    }
    else if (uVar7 < this->minCodeLength) {
LAB_001e4d5f:
      BitIStream::skipBits(inputStream,qVar3 & 0xffffffff);
      if (uVar7 < 8) {
        unaff_BL = (-1 << ((byte)qVar3 & 0x1f) ^ local_3c >> (-(byte)qVar3 & 0x1f)) == 0xffffffff;
        goto LAB_001e4d9c;
      }
LAB_001e4dd6:
      bVar8 = false;
      unaff_BL = 0;
    }
    else {
      pPVar2 = (this->prefixTables).
               super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->prefixTables).
          super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>._M_impl.
          super__Vector_impl_data._M_finish == pPVar2) {
LAB_001e4e0b:
        decodeStream();
        goto LAB_001e4e10;
      }
      cVar1 = (char)pPVar2->indexLength;
      table._1_7_ = (undefined7)(from >> 8);
      table.prefixLength._0_1_ = cVar1;
      table.offset = pPVar2->offset;
      PVar9 = tableEntry(this,table,local_3c >> (-cVar1 & 0x1fU));
      uVar4 = PVar9._0_8_ >> 0x20;
      if (uVar4 != 0) {
        qVar6 = PVar9.nextTable;
        do {
          pPVar2 = (this->prefixTables).
                   super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar5 = ((long)(this->prefixTables).
                         super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 2) *
                  -0x5555555555555555;
          if (uVar5 < uVar4 || uVar5 - uVar4 == 0) {
            decodeStream();
            goto LAB_001e4e0b;
          }
          table_00.offset = pPVar2[uVar4].offset;
          table_00._0_8_ = uVar4 * 3;
          PVar9 = tableEntry(this,table_00,
                             (local_3c << ((byte)pPVar2[uVar4].prefixLength & 0x1f)) >>
                             (-(char)pPVar2[uVar4].indexLength & 0x1fU));
          uVar4 = PVar9._0_8_ >> 0x20;
          bVar8 = qVar6 != PVar9.nextTable;
          qVar6 = PVar9.nextTable;
        } while (bVar8);
      }
      if (uVar7 < PVar9.bitLength) goto LAB_001e4d5f;
      if ((PVar9.bitLength == 0) || (PVar9.byteValue == 0x100)) {
        BitIStream::skipBits(inputStream,qVar3 & 0xffffffff);
        goto LAB_001e4dd6;
      }
      QByteArray::append((char)outputBuffer);
      BitIStream::skipBits(inputStream,PVar9._0_8_ & 0xffffffff);
      bVar8 = true;
    }
  } while (bVar8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(unaff_BL & 1);
  }
LAB_001e4e10:
  __stack_chk_fail();
}

Assistant:

bool HuffmanDecoder::decodeStream(BitIStream &inputStream, QByteArray &outputBuffer)
{
    while (true) {
        quint32 chunk = 0;
        const quint32 readBits = inputStream.peekBits(inputStream.streamOffset(), 32, &chunk);
        if (!readBits)
            return !inputStream.hasMoreBits();

        if (readBits < minCodeLength) {
            inputStream.skipBits(readBits);
            return padding_is_valid(chunk, readBits);
        }

        quint32 tableIndex = 0;
        const PrefixTable *table = &prefixTables[tableIndex];
        quint32 entryIndex = chunk >> (32 - table->indexLength);
        PrefixTableEntry entry = tableEntry(*table, entryIndex);

        while (true) {
            if (entry.nextTable == tableIndex)
                break;

            tableIndex = entry.nextTable;
            table = &prefixTables[tableIndex];
            entryIndex = chunk << table->prefixLength >> (32 - table->indexLength);
            entry = tableEntry(*table, entryIndex);
        }

        if (entry.bitLength > readBits) {
            inputStream.skipBits(readBits);
            return padding_is_valid(chunk, readBits);
        }

        if (!entry.bitLength || entry.byteValue == 256) {
            //EOS (256) == compression error (HPACK).
            inputStream.skipBits(readBits);
            return false;
        }

        outputBuffer.append(entry.byteValue);
        inputStream.skipBits(entry.bitLength);
    }

    return false;
}